

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

Expression * __thiscall slang::ast::CoverCrossSymbol::getIffExpr(CoverCrossSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *this_00;
  ExpressionSyntax *pEVar2;
  int iVar3;
  CoverCrossSyntax *pCVar4;
  undefined4 extraout_var;
  ASTContext local_48;
  
  if ((this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged != false)
  goto LAB_003c3ec1;
  pSVar1 = (this->super_Symbol).parentScope;
  if (pSVar1 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
               ,0x369,"const Expression *slang::ast::CoverCrossSymbol::getIffExpr() const");
  }
  this_00 = (this->super_Symbol).originatingSyntax;
  if (this_00 == (SyntaxNode *)0x0) {
    (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
         (Expression *)0x0;
  }
  else {
    pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::CoverCrossSyntax>(this_00);
    if (pCVar4->iff != (CoverageIffClauseSyntax *)0x0) {
      local_48.lookupIndex = 0;
      local_48.flags.m_bits = 0;
      local_48.instanceOrProc = (Symbol *)0x0;
      local_48.firstTempVar = (TempVarSymbol *)0x0;
      local_48.randomizeDetails = (RandomizeDetails *)0x0;
      local_48.assertionInstance = (AssertionInstanceDetails *)0x0;
      pEVar2 = (pCVar4->iff->expr).ptr;
      local_48.scope.ptr = pSVar1;
      if (pEVar2 == (ExpressionSyntax *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                  );
      }
      iVar3 = Expression::bind((int)pEVar2,(sockaddr *)&local_48,0x8000000);
      (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
           (Expression *)CONCAT44(extraout_var,iVar3);
      (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
      ASTContext::requireBooleanConvertible(&local_48,(Expression *)CONCAT44(extraout_var,iVar3));
      goto LAB_003c3ec1;
    }
    (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
         (Expression *)0x0;
    if ((this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged != false)
    goto LAB_003c3ec1;
  }
  (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
LAB_003c3ec1:
  return (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload
         .super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value;
}

Assistant:

const Expression* CoverCrossSymbol::getIffExpr() const {
    if (!iffExpr) {
        auto scope = getParentScope();
        auto syntax = getSyntax();
        ASSERT(scope);

        if (!syntax)
            iffExpr = nullptr;
        else {
            auto iffSyntax = syntax->as<CoverCrossSyntax>().iff;
            if (!iffSyntax)
                iffExpr = nullptr;
            else {
                ASTContext context(*scope, LookupLocation::min);
                iffExpr = &Expression::bind(*iffSyntax->expr, context,
                                            ASTFlags::AllowCoverageSampleFormal);
                context.requireBooleanConvertible(*iffExpr.value());
            }
        }
    }
    return *iffExpr;
}